

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_processing.c
# Opt level: O0

void WebPMultARGBRow_C(uint32_t *ptr,int width,int inverse)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  uint32_t out;
  uint32_t scale;
  uint32_t alpha;
  uint32_t argb;
  int x;
  undefined4 local_14;
  
  for (local_14 = 0; local_14 < in_ESI; local_14 = local_14 + 1) {
    uVar1 = *(uint *)(in_RDI + (long)local_14 * 4);
    if (uVar1 < 0xff000000) {
      if (uVar1 < 0x1000000) {
        *(undefined4 *)(in_RDI + (long)local_14 * 4) = 0;
      }
      else {
        uVar2 = GetScale(uVar1 >> 0x18,in_EDX);
        uVar3 = Mult((uint8_t)uVar1,uVar2);
        uVar4 = Mult((uint8_t)(uVar1 >> 8),uVar2);
        uVar2 = Mult((uint8_t)(uVar1 >> 0x10),uVar2);
        *(uint32_t *)(in_RDI + (long)local_14 * 4) =
             uVar2 << 0x10 | uVar4 << 8 | uVar3 | uVar1 & 0xff000000;
      }
    }
  }
  return;
}

Assistant:

void WebPMultARGBRow_C(uint32_t* const ptr, int width, int inverse) {
  int x;
  for (x = 0; x < width; ++x) {
    const uint32_t argb = ptr[x];
    if (argb < 0xff000000u) {      // alpha < 255
      if (argb <= 0x00ffffffu) {   // alpha == 0
        ptr[x] = 0;
      } else {
        const uint32_t alpha = (argb >> 24) & 0xff;
        const uint32_t scale = GetScale(alpha, inverse);
        uint32_t out = argb & 0xff000000u;
        out |= Mult(argb >>  0, scale) <<  0;
        out |= Mult(argb >>  8, scale) <<  8;
        out |= Mult(argb >> 16, scale) << 16;
        ptr[x] = out;
      }
    }
  }
}